

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.c
# Opt level: O0

ZyanU32 ZyanMemoryGetSystemPageSize(void)

{
  long lVar1;
  
  lVar1 = sysconf(0x1e);
  return (ZyanU32)lVar1;
}

Assistant:

ZyanU32 ZyanMemoryGetSystemPageSize()
{
#if defined(ZYAN_WINDOWS)

    SYSTEM_INFO system_info;
    GetSystemInfo(&system_info);

    return system_info.dwPageSize;

#elif defined(ZYAN_POSIX)

    return sysconf(_SC_PAGE_SIZE);

#endif
}